

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::GenerateInstallerFile(cmCPackIFWInstaller *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  ulong uVar2;
  reference ppcVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pvVar6;
  char *msg;
  string local_cb0 [32];
  undefined1 local_c90 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  undefined1 local_af8 [8];
  string path_7;
  string name_7;
  size_t i;
  cmCPackIFWResourcesParser parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resources;
  string local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  undefined1 local_9d8 [8];
  string path_6;
  string name_6;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  cmCPackIFWRepository *local_880;
  cmCPackIFWRepository *r;
  iterator __end2;
  iterator __begin2;
  RepositoriesVector *__range2;
  string local_858;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  undefined1 local_6d8 [8];
  string path_5;
  string name_5;
  string local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  undefined1 local_650 [8];
  string path_4;
  string name_4;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  undefined1 local_5c8 [8];
  string path_3;
  string name_3;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_540 [8];
  string path_2;
  string name_2;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [8];
  string path_1;
  string name_1;
  string local_470;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  string path;
  string name;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  undefined1 local_2e0 [8];
  cmXMLWriter xout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  cmGeneratedFileStream fout;
  cmCPackIFWInstaller *this_local;
  
  fout._576_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) && ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0)
     ) {
    std::__cxx11::string::operator=
              ((string *)&this->Directory,
               (string *)
               &(((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).toplevel);
  }
  std::operator+(&local_278,&this->Directory,"/config/config.xml");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_258,&local_278,false,None);
  std::__cxx11::string::~string((string *)&local_278);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2e0,(ostream *)local_258,0);
  cmXMLWriter::StartDocument((cmXMLWriter *)local_2e0,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,(cmXMLWriter *)local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"Installer",&local_301);
  cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"Name",&local_329);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_328,&this->Name);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"Version",&local_351);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_350,&this->Version);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Title",&local_379);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_378,&this->Title);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Publisher",&local_3a1);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_3a0,&this->Publisher)
    ;
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"ProductUrl",
               (allocator<char> *)(name.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_3c8,&this->ProductUrl);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName
              ((string *)((long)&path.field_2 + 8),&this->InstallerApplicationIcon);
    std::operator+(&local_430,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                   &local_430,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_430);
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_450,(string *)((long)&path.field_2 + 8));
    std::__cxx11::string::operator=((string *)(path.field_2._M_local_buf + 8),(string *)&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerApplicationIcon,(string *)local_410);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"InstallerApplicationIcon",
               (allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_470,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_410);
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName
              ((string *)((long)&path_1.field_2 + 8),&this->InstallerWindowIcon);
    std::operator+(&local_4d8,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                   &local_4d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_4d8);
    cmsys::SystemTools::CopyFileIfDifferent(&this->InstallerWindowIcon,(string *)local_4b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,"InstallerWindowIcon",
               (allocator<char> *)(name_2.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_4f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)(name_2.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_4b8);
    std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_2.field_2 + 8),&this->Logo);
    std::operator+(&local_560,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                   &local_560,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_2.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_560);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Logo,(string *)local_540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"Logo",(allocator<char> *)(name_3.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_580,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_2.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator((allocator<char> *)(name_3.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_540);
    std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_3.field_2 + 8),&this->Banner);
    std::operator+(&local_5e8,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                   &local_5e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_3.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_5e8);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Banner,(string *)local_5c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"Banner",(allocator<char> *)(name_4.field_2._M_local_buf + 0xf))
    ;
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_608,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_3.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator((allocator<char> *)(name_4.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_5c8);
    std::__cxx11::string::~string((string *)(path_3.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_4.field_2 + 8),&this->Watermark);
    std::operator+(&local_670,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                   &local_670,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_4.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_670);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Watermark,(string *)local_650);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_690,"Watermark",
               (allocator<char> *)(name_5.field_2._M_local_buf + 0xf));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_690,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_4.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator((allocator<char> *)(name_5.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_650);
    std::__cxx11::string::~string((string *)(path_4.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_5.field_2 + 8),&this->Background);
    std::operator+(&local_6f8,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d8,
                   &local_6f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_5.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_6f8);
    cmsys::SystemTools::CopyFileIfDifferent(&this->Background,(string *)local_6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"Background",&local_719)
    ;
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_718,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_5.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator(&local_719);
    std::__cxx11::string::~string((string *)local_6d8);
    std::__cxx11::string::~string((string *)(path_5.field_2._M_local_buf + 8));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"WizardStyle",&local_741);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_740,&this->WizardStyle);
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator(&local_741);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_768,"WizardDefaultWidth",&local_769);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_768,&this->WizardDefaultWidth);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_790,"WizardDefaultHeight",&local_791);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_790,&this->WizardDefaultHeight);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator(&local_791);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"TitleColor",&local_7b9)
    ;
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_7b8,&this->TitleColor);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator(&local_7b9);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"StartMenuDir",&local_7e1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_7e0,&this->StartMenuDir);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"TargetDir",&local_809);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_808,&this->TargetDir)
    ;
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_830,"AdminTargetDir",&local_831);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_830,&this->AdminTargetDir);
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator(&local_831);
  }
  bVar1 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::empty
                    (&this->RemoteRepositories);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_858,"RemoteRepositories",(allocator<char> *)((long)&__range2 + 7));
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_858);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::begin
                       (&this->RemoteRepositories);
    r = (cmCPackIFWRepository *)
        std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::end
                  (&this->RemoteRepositories);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
                                       *)&r), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
                ::operator*(&__end2);
      local_880 = *ppcVar3;
      cmCPackIFWRepository::WriteRepositoryConfig(local_880,(cmXMLWriter *)local_2e0);
      __gnu_cxx::
      __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
      ::operator++(&__end2);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"MaintenanceToolName",&local_8a1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_8a0,&this->MaintenanceToolName);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::allocator<char>::~allocator(&local_8a1);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c8,"MaintenanceToolIniFile",&local_8c9);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_8c8,&this->MaintenanceToolIniFile);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::allocator<char>::~allocator(&local_8c9);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"RemoveTargetDir",&local_8f1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_8f0,&this->RemoveTargetDir);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator(&local_8f1);
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if (bVar1) {
    cmXMLWriter::Comment((cmXMLWriter *)local_2e0,"CPack IFW default policy for QtIFW less 2.0");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_918,"AllowNonAsciiCharacters",&local_919);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_918,(char (*) [5])0x81514e);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator(&local_919);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_940,"AllowSpaceInPath",&local_941);
    cmXMLWriter::Element<char[5]>((cmXMLWriter *)local_2e0,&local_940,(char (*) [5])0x81514e);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_968,"AllowNonAsciiCharacters",&local_969);
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_2e0,&local_968,&this->AllowNonAsciiCharacters);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator(&local_969);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_990,"AllowSpaceInPath",
                 (allocator<char> *)(name_6.field_2._M_local_buf + 0xf));
      cmXMLWriter::Element<std::__cxx11::string>
                ((cmXMLWriter *)local_2e0,&local_990,&this->AllowSpaceInPath);
      std::__cxx11::string::~string((string *)&local_990);
      std::allocator<char>::~allocator((allocator<char> *)(name_6.field_2._M_local_buf + 0xf));
    }
  }
  bVar1 = cmCPackIFWCommon::IsVersionLess(&this->super_cmCPackIFWCommon,"2.0");
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    cmsys::SystemTools::GetFilenameName((string *)((long)&path_6.field_2 + 8),&this->ControlScript);
    std::operator+(&local_9f8,&this->Directory,"/config/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   &local_9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&path_6.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_9f8);
    cmsys::SystemTools::CopyFileIfDifferent(&this->ControlScript,(string *)local_9d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"ControlScript",
               (allocator<char> *)
               ((long)&resources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_2e0,&local_a18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&path_6.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&resources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)local_9d8);
    std::__cxx11::string::~string((string *)(path_6.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Resources);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&parser.basePath.field_2 + 8));
    cmCPackIFWResourcesParser::cmCPackIFWResourcesParser((cmCPackIFWResourcesParser *)&i,this);
    for (name_7.field_2._8_8_ = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->Resources), (ulong)name_7.field_2._8_8_ < sVar4;
        name_7.field_2._8_8_ = name_7.field_2._8_8_ + 1) {
      bVar1 = cmCPackIFWResourcesParser::ParseResource
                        ((cmCPackIFWResourcesParser *)&i,name_7.field_2._8_8_);
      if (bVar1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Resources,name_7.field_2._8_8_);
        cmsys::SystemTools::GetFilenameName((string *)((long)&path_7.field_2 + 8),pvVar6);
        std::operator+(&local_b18,&this->Directory,"/resources/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_af8,&local_b18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&path_7.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_b18);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Resources,name_7.field_2._8_8_);
        cmsys::SystemTools::CopyFileIfDifferent(pvVar6,(string *)local_af8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&parser.basePath.field_2 + 8),
                    (value_type *)((long)&path_7.field_2 + 8));
        std::__cxx11::string::~string((string *)local_af8);
        std::__cxx11::string::~string((string *)(path_7.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c90);
        poVar5 = std::operator<<((ostream *)local_c90,"Can\'t copy resources from \"");
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Resources,name_7.field_2._8_8_);
        poVar5 = std::operator<<(poVar5,(string *)pvVar6);
        poVar5 = std::operator<<(poVar5,"\". Resource will be skipped.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          msg = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(this_00,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                          ,0x1da,msg);
          std::__cxx11::string::~string(local_cb0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c90);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->Resources,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&parser.basePath.field_2 + 8));
    cmCPackIFWResourcesParser::~cmCPackIFWResourcesParser((cmCPackIFWResourcesParser *)&i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&parser.basePath.field_2 + 8));
  }
  cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
  cmXMLWriter::EndDocument((cmXMLWriter *)local_2e0);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2e0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  return;
}

Assistant:

void cmCPackIFWInstaller::GenerateInstallerFile()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Output stream
  cmGeneratedFileStream fout(this->Directory + "/config/config.xml");
  cmXMLWriter xout(fout);

  xout.StartDocument();

  WriteGeneratedByToStrim(xout);

  xout.StartElement("Installer");

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);
  xout.Element("Title", this->Title);

  if (!this->Publisher.empty()) {
    xout.Element("Publisher", this->Publisher);
  }

  if (!this->ProductUrl.empty()) {
    xout.Element("ProductUrl", this->ProductUrl);
  }

  // ApplicationIcon
  if (!this->InstallerApplicationIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerApplicationIcon);
    std::string path = this->Directory + "/config/" + name;
    name = cmSystemTools::GetFilenameWithoutExtension(name);
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerApplicationIcon,
                                            path);
    xout.Element("InstallerApplicationIcon", name);
  }

  // WindowIcon
  if (!this->InstallerWindowIcon.empty()) {
    std::string name =
      cmSystemTools::GetFilenameName(this->InstallerWindowIcon);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->InstallerWindowIcon, path);
    xout.Element("InstallerWindowIcon", name);
  }

  // Logo
  if (!this->Logo.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Logo);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Logo, path);
    xout.Element("Logo", name);
  }

  // Banner
  if (!this->Banner.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Banner);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Banner, path);
    xout.Element("Banner", name);
  }

  // Watermark
  if (!this->Watermark.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Watermark);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Watermark, path);
    xout.Element("Watermark", name);
  }

  // Background
  if (!this->Background.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Background);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Background, path);
    xout.Element("Background", name);
  }

  // WizardStyle
  if (!this->WizardStyle.empty()) {
    xout.Element("WizardStyle", this->WizardStyle);
  }

  // WizardDefaultWidth
  if (!this->WizardDefaultWidth.empty()) {
    xout.Element("WizardDefaultWidth", this->WizardDefaultWidth);
  }

  // WizardDefaultHeight
  if (!this->WizardDefaultHeight.empty()) {
    xout.Element("WizardDefaultHeight", this->WizardDefaultHeight);
  }

  // TitleColor
  if (!this->TitleColor.empty()) {
    xout.Element("TitleColor", this->TitleColor);
  }

  // Start menu
  if (!this->IsVersionLess("2.0")) {
    xout.Element("StartMenuDir", this->StartMenuDir);
  }

  // Target dir
  if (!this->TargetDir.empty()) {
    xout.Element("TargetDir", this->TargetDir);
  }

  // Admin target dir
  if (!this->AdminTargetDir.empty()) {
    xout.Element("AdminTargetDir", this->AdminTargetDir);
  }

  // Remote repositories
  if (!this->RemoteRepositories.empty()) {
    xout.StartElement("RemoteRepositories");
    for (cmCPackIFWRepository* r : this->RemoteRepositories) {
      r->WriteRepositoryConfig(xout);
    }
    xout.EndElement();
  }

  // Maintenance tool
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolName.empty()) {
    xout.Element("MaintenanceToolName", this->MaintenanceToolName);
  }

  // Maintenance tool ini file
  if (!this->IsVersionLess("2.0") && !this->MaintenanceToolIniFile.empty()) {
    xout.Element("MaintenanceToolIniFile", this->MaintenanceToolIniFile);
  }

  if (!this->RemoveTargetDir.empty()) {
    xout.Element("RemoveTargetDir", this->RemoveTargetDir);
  }

  // Different allows
  if (this->IsVersionLess("2.0")) {
    // CPack IFW default policy
    xout.Comment("CPack IFW default policy for QtIFW less 2.0");
    xout.Element("AllowNonAsciiCharacters", "true");
    xout.Element("AllowSpaceInPath", "true");
  } else {
    if (!this->AllowNonAsciiCharacters.empty()) {
      xout.Element("AllowNonAsciiCharacters", this->AllowNonAsciiCharacters);
    }
    if (!this->AllowSpaceInPath.empty()) {
      xout.Element("AllowSpaceInPath", this->AllowSpaceInPath);
    }
  }

  // Control script (copy to config dir)
  if (!this->IsVersionLess("2.0") && !this->ControlScript.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->ControlScript);
    std::string path = this->Directory + "/config/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->ControlScript, path);
    xout.Element("ControlScript", name);
  }

  // Resources (copy to resources dir)
  if (!this->Resources.empty()) {
    std::vector<std::string> resources;
    cmCPackIFWResourcesParser parser(this);
    for (size_t i = 0; i < this->Resources.size(); i++) {
      if (parser.ParseResource(i)) {
        std::string name = cmSystemTools::GetFilenameName(this->Resources[i]);
        std::string path = this->Directory + "/resources/" + name;
        cmsys::SystemTools::CopyFileIfDifferent(this->Resources[i], path);
        resources.push_back(std::move(name));
      } else {
        cmCPackIFWLogger(WARNING,
                         "Can't copy resources from \""
                           << this->Resources[i]
                           << "\". Resource will be skipped." << std::endl);
      }
    }
    this->Resources = resources;
  }

  xout.EndElement();
  xout.EndDocument();
}